

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcRobustBufferAccessBehaviorTests.cpp
# Opt level: O0

void deqp::RobustBufferAccessBehavior::Texture::Generate(Functions *gl,GLuint *out_id)

{
  deUint32 err;
  TestError *this;
  GLuint local_1c;
  GLuint *pGStack_18;
  GLuint id;
  GLuint *out_id_local;
  Functions *gl_local;
  
  local_1c = 0xffffffff;
  pGStack_18 = out_id;
  out_id_local = (GLuint *)gl;
  (*gl->genTextures)(1,&local_1c);
  err = (**(code **)(out_id_local + 0x200))();
  glu::checkError(err,"GenTextures",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                  ,0x2ce);
  if (local_1c == 0xffffffff) {
    this = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this,"Invalid id",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
               ,0x2d2);
    __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  *pGStack_18 = local_1c;
  return;
}

Assistant:

void Texture::Generate(const glw::Functions& gl, glw::GLuint& out_id)
{
	GLuint id = m_invalid_id;

	gl.genTextures(1, &id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GenTextures");

	if (m_invalid_id == id)
	{
		TCU_FAIL("Invalid id");
	}

	out_id = id;
}